

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O2

wchar_t archive_match_path_excluded(archive *_a,archive_entry *entry)

{
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  void *pathname;
  
  iVar1 = __archive_check_magic(_a,0xcad11c9,1,"archive_match_path_excluded");
  if (iVar1 == -0x1e) {
    wVar2 = L'\xffffffe2';
  }
  else if (entry == (archive_entry *)0x0) {
    archive_set_error(_a,0x16,"entry is NULL");
    wVar2 = L'\xffffffe7';
  }
  else {
    wVar2 = L'\0';
    if ((_a[1].magic & 1) != 0) {
      pcVar3 = archive_entry_pathname(entry);
      wVar2 = path_excluded((archive_match *)_a,(wchar_t)pcVar3,pathname);
      return wVar2;
    }
  }
  return wVar2;
}

Assistant:

int
archive_match_path_excluded(struct archive *_a,
    struct archive_entry *entry)
{
	struct archive_match *a;

	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_match_path_excluded");

	a = (struct archive_match *)_a;
	if (entry == NULL) {
		archive_set_error(&(a->archive), EINVAL, "entry is NULL");
		return (ARCHIVE_FAILED);
	}

	/* If we don't have exclusion/inclusion pattern set at all,
	 * the entry is always not excluded. */
	if ((a->setflag & PATTERN_IS_SET) == 0)
		return (0);
#if defined(_WIN32) && !defined(__CYGWIN__)
	return (path_excluded(a, 0, archive_entry_pathname_w(entry)));
#else
	return (path_excluded(a, 1, archive_entry_pathname(entry)));
#endif
}